

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1506.c
# Opt level: O0

int test(char *URL)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  curl_slist *pcVar4;
  undefined8 uVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  timeval tVar9;
  timeval older;
  timeval older_00;
  int ec_9;
  CURLMcode ec_8;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_44c;
  CURLMcode ec_7;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLMcode ec_1;
  CURLcode ec;
  __suseconds_t local_290;
  char *address;
  char *port;
  curl_slist *slist2;
  curl_slist *slist;
  char dnsentry [256];
  char target_url [256];
  int local_5c;
  long lStack_58;
  int i;
  CURLM *m;
  int running;
  CURL *curl [4];
  int local_1c;
  int res;
  char *URL_local;
  
  local_1c = 0;
  memset(&stack0xffffffffffffffb8,0,0x20);
  pcVar1 = libtest_arg3;
  pcVar8 = libtest_arg2;
  lStack_58 = 0;
  slist2 = (curl_slist *)0x0;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    curl_msnprintf(&slist,0x100,"server%d.example.com:%s:%s",local_5c + 1,pcVar1,pcVar8);
    curl_mprintf("%s\n",&slist);
    pcVar4 = (curl_slist *)curl_slist_append(slist2,&slist);
    if (pcVar4 == (curl_slist *)0x0) {
      curl_mfprintf(_stderr,"curl_slist_append() failed\n");
      goto LAB_00102d9a;
    }
    slist2 = pcVar4;
  }
  tVar9 = tutil_tvnow();
  _ec_1 = tVar9.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_290 = tVar9.tv_usec;
  tv_test_start.tv_usec = local_290;
  iVar3 = curl_global_init(3);
  uVar2 = _stderr;
  if (iVar3 != 0) {
    uVar5 = curl_easy_strerror(iVar3);
    curl_mfprintf(uVar2,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                  ,0x3e,iVar3,uVar5);
    local_1c = iVar3;
  }
  if (local_1c == 0) {
    lStack_58 = curl_multi_init();
    if (lStack_58 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x40);
      local_1c = 0x7b;
    }
    if (local_1c == 0) {
      iVar3 = curl_multi_setopt(lStack_58,6,3);
      uVar2 = _stderr;
      if (iVar3 != 0) {
        uVar5 = curl_multi_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                      ,0x42,iVar3,uVar5);
        local_1c = iVar3;
      }
      if (local_1c == 0) {
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          lVar6 = curl_easy_init();
          *(long *)(&stack0xffffffffffffffb8 + (long)local_5c * 8) = lVar6;
          if (lVar6 == 0) {
            curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                          ,0x47);
            local_1c = 0x7c;
          }
          if (local_1c != 0) goto LAB_00102d9a;
          curl_msnprintf(dnsentry + 0xf8,0x100,"http://server%d.example.com:%s/path/1506%04i",
                         local_5c + 1,pcVar1,local_5c + 1);
          iVar3 = curl_easy_setopt(*(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8),
                                   0x2712,dnsentry + 0xf8);
          uVar2 = _stderr;
          if (iVar3 != 0) {
            uVar5 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                          ,0x4d,iVar3,uVar5);
            local_1c = iVar3;
          }
          if (local_1c != 0) goto LAB_00102d9a;
          iVar3 = curl_easy_setopt(*(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8),
                                   0x29,1);
          uVar2 = _stderr;
          if (iVar3 != 0) {
            uVar5 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                          ,0x4f,iVar3,uVar5);
            local_1c = iVar3;
          }
          if (local_1c != 0) goto LAB_00102d9a;
          iVar3 = curl_easy_setopt(*(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8),
                                   0x2a,1);
          uVar2 = _stderr;
          if (iVar3 != 0) {
            uVar5 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                          ,0x51,iVar3,uVar5);
            local_1c = iVar3;
          }
          if (local_1c != 0) goto LAB_00102d9a;
          iVar3 = curl_easy_setopt(*(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8),
                                   0x27db,slist2);
          uVar2 = _stderr;
          if (iVar3 != 0) {
            uVar5 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                          ,0x53,iVar3,uVar5);
            local_1c = iVar3;
          }
          if (local_1c != 0) goto LAB_00102d9a;
        }
        curl_mfprintf(_stderr,"Start at URL 0\n");
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          iVar3 = curl_multi_add_handle
                            (lStack_58,
                             *(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8));
          uVar2 = _stderr;
          if (iVar3 != 0) {
            uVar5 = curl_multi_strerror(iVar3);
            curl_mfprintf(uVar2,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                          ,0x5a,iVar3,uVar5);
            local_1c = iVar3;
          }
          while( true ) {
            if (local_1c != 0) goto LAB_00102d9a;
            local_44c = -99;
            rd.__fds_bits[0xf] = 1;
            iVar3 = curl_multi_perform(lStack_58,(long)&m + 4);
            uVar2 = _stderr;
            if (iVar3 == 0) {
              if (m._4_4_ < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                              ,100,m._4_4_);
                local_1c = 0x7a;
              }
            }
            else {
              uVar5 = curl_multi_strerror(iVar3);
              curl_mfprintf(uVar2,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                            ,100,iVar3,uVar5);
              local_1c = iVar3;
            }
            if (local_1c != 0) goto LAB_00102d9a;
            tVar9 = tutil_tvnow();
            older.tv_usec = tv_test_start.tv_usec;
            older.tv_sec = tv_test_start.tv_sec;
            lVar6 = tutil_tvdiff(tVar9,older);
            if (60000 < lVar6) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                            ,0x66);
              local_1c = 0x7d;
            }
            if (local_1c != 0) goto LAB_00102d9a;
            if (m._4_4_ == 0) break;
            for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
              wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
            }
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
            }
            for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
              (&ec_7 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
              (&ec_7 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
            }
            iVar3 = curl_multi_fdset(lStack_58,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,&ec_7,
                                     &local_44c);
            uVar2 = _stderr;
            if (iVar3 == 0) {
              if (local_44c < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                              ,0x6f,local_44c);
                local_1c = 0x7a;
              }
            }
            else {
              uVar5 = curl_multi_strerror(iVar3);
              curl_mfprintf(uVar2,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                            ,0x6f,iVar3,uVar5);
              local_1c = iVar3;
            }
            if (local_1c != 0) goto LAB_00102d9a;
            iVar3 = select_wrapper(local_44c + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                   (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)&ec_7,
                                   (timeval *)(rd.__fds_bits + 0xf));
            if (iVar3 == -1) {
              piVar7 = __errno_location();
              uVar2 = _stderr;
              iVar3 = *piVar7;
              pcVar8 = strerror(iVar3);
              curl_mfprintf(uVar2,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                            ,0x73,iVar3,pcVar8);
              local_1c = 0x79;
            }
            if (local_1c != 0) goto LAB_00102d9a;
            tVar9 = tutil_tvnow();
            older_00.tv_usec = tv_test_start.tv_usec;
            older_00.tv_sec = tv_test_start.tv_sec;
            lVar6 = tutil_tvdiff(tVar9,older_00);
            if (60000 < lVar6) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                            ,0x75);
              local_1c = 0x7d;
            }
          }
          wait_ms(1);
        }
      }
    }
LAB_00102d9a:
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      curl_multi_remove_handle
                (lStack_58,*(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8));
      curl_easy_cleanup(*(undefined8 *)(&stack0xffffffffffffffb8 + (long)local_5c * 8));
    }
    curl_slist_free_all(slist2);
    curl_multi_cleanup(lStack_58);
    curl_global_cleanup();
    URL_local._4_4_ = local_1c;
  }
  else {
    URL_local._4_4_ = local_1c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {0};
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  char dnsentry[256];
  struct curl_slist *slist = NULL, *slist2;
  char *port = libtest_arg3;
  char *address = libtest_arg2;

  (void)URL;

  /* Create fake DNS entries for serverX.example.com for all handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    msnprintf(dnsentry, sizeof(dnsentry), "server%d.example.com:%s:%s",
              i + 1, port, address);
    printf("%s\n", dnsentry);
    slist2 = curl_slist_append(slist, dnsentry);
    if(!slist2) {
      fprintf(stderr, "curl_slist_append() failed\n");
      goto test_cleanup;
    }
    slist = slist2;
  }

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  multi_setopt(m, CURLMOPT_MAXCONNECTS, 3L);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server%d.example.com:%s/path/1506%04i",
              i + 1, port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_RESOLVE, slist);
  }

  fprintf(stderr, "Start at URL 0\n");

  for(i = 0; i < NUM_HANDLES; i++) {
    /* add handle to multi */
    multi_add_handle(m, curl[i]);

    for(;;) {
      struct timeval interval;
      fd_set rd, wr, exc;
      int maxfd = -99;

      interval.tv_sec = 1;
      interval.tv_usec = 0;

      multi_perform(m, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&rd);
      FD_ZERO(&wr);
      FD_ZERO(&exc);

      multi_fdset(m, &rd, &wr, &exc, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      select_test(maxfd + 1, &rd, &wr, &exc, &interval);

      abort_on_test_timeout();
    }
    wait_ms(1); /* to ensure different end times */
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_slist_free_all(slist);

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}